

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_rx(tftp_state_data_t *state,tftp_event_t event)

{
  Curl_easy *data_00;
  connectdata *pcVar1;
  unsigned_short uVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  Curl_easy *data;
  int rblock;
  ssize_t sbytes;
  tftp_event_t event_local;
  tftp_state_data_t *state_local;
  
  data_00 = state->conn->data;
  switch(event) {
  case TFTP_EVENT_DATA:
    uVar2 = getrpacketblock(&state->rpacket);
    uVar3 = (uint)uVar2;
    if ((state->block + 1 & 0xffff) == uVar3) {
      state->retries = 0;
    }
    else {
      if (state->block != uVar3) {
        Curl_infof(data_00,"Received unexpected DATA packet block %d, expecting block %d\n",
                   (ulong)uVar3,(ulong)(state->block + 1 & 0xffff));
        return CURLE_OK;
      }
      Curl_infof(data_00,"Received last DATA packet block %d again.\n",(ulong)uVar3);
    }
    state->block = uVar2;
    setpacketevent(&state->spacket,4);
    setpacketblock(&state->spacket,state->block);
    sVar4 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (sVar4 < 0) {
      pcVar1 = state->conn;
      piVar5 = __errno_location();
      pcVar6 = Curl_strerror(pcVar1,*piVar5);
      Curl_failf(data_00,"%s",pcVar6);
      return CURLE_SEND_ERROR;
    }
    if ((long)state->rbytes < (long)state->blksize + 4) {
      state->state = TFTP_STATE_FIN;
    }
    else {
      state->state = TFTP_STATE_RX;
    }
    time(&state->rx_time);
    break;
  default:
    Curl_failf(data_00,"%s","tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL;
  case TFTP_EVENT_ERROR:
    setpacketevent(&state->spacket,5);
    setpacketblock(&state->spacket,state->block);
    sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
           state->remote_addrlen);
    state->state = TFTP_STATE_FIN;
    break;
  case TFTP_EVENT_OACK:
    state->block = 0;
    state->retries = 0;
    setpacketevent(&state->spacket,4);
    setpacketblock(&state->spacket,state->block);
    sVar4 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (sVar4 < 0) {
      pcVar1 = state->conn;
      piVar5 = __errno_location();
      pcVar6 = Curl_strerror(pcVar1,*piVar5);
      Curl_failf(data_00,"%s",pcVar6);
      return CURLE_SEND_ERROR;
    }
    state->state = TFTP_STATE_RX;
    time(&state->rx_time);
    break;
  case TFTP_EVENT_TIMEOUT:
    state->retries = state->retries + 1;
    Curl_infof(data_00,"Timeout waiting for block %d ACK.  Retries = %d\n",
               (ulong)(state->block + 1 & 0xffff),(ulong)(uint)state->retries);
    if (state->retry_max < state->retries) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      sVar4 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                     state->remote_addrlen);
      if (sVar4 < 0) {
        pcVar1 = state->conn;
        piVar5 = __errno_location();
        pcVar6 = Curl_strerror(pcVar1,*piVar5);
        Curl_failf(data_00,"%s",pcVar6);
        return CURLE_SEND_ERROR;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_rx(tftp_state_data_t *state, tftp_event_t event)
{
  ssize_t sbytes;
  int rblock;
  struct Curl_easy *data = state->conn->data;

  switch(event) {

  case TFTP_EVENT_DATA:
    /* Is this the block we expect? */
    rblock = getrpacketblock(&state->rpacket);
    if(NEXT_BLOCKNUM(state->block) == rblock) {
      /* This is the expected block.  Reset counters and ACK it. */
      state->retries = 0;
    }
    else if(state->block == rblock) {
      /* This is the last recently received block again. Log it and ACK it
         again. */
      infof(data, "Received last DATA packet block %d again.\n", rblock);
    }
    else {
      /* totally unexpected, just log it */
      infof(data,
            "Received unexpected DATA packet block %d, expecting block %d\n",
            rblock, NEXT_BLOCKNUM(state->block));
      break;
    }

    /* ACK this block. */
    state->block = (unsigned short)rblock;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
      return CURLE_SEND_ERROR;
    }

    /* Check if completed (That is, a less than full packet is received) */
    if(state->rbytes < (ssize_t)state->blksize + 4) {
      state->state = TFTP_STATE_FIN;
    }
    else {
      state->state = TFTP_STATE_RX;
    }
    time(&state->rx_time);
    break;

  case TFTP_EVENT_OACK:
    /* ACK option acknowledgement so we can move on to data */
    state->block = 0;
    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
      return CURLE_SEND_ERROR;
    }

    /* we're ready to RX data */
    state->state = TFTP_STATE_RX;
    time(&state->rx_time);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry count and fail if over the limit */
    state->retries++;
    infof(data,
          "Timeout waiting for block %d ACK.  Retries = %d\n",
          NEXT_BLOCKNUM(state->block), state->retries);
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Resend the previous ACK */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      if(sbytes<0) {
        failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
        return CURLE_SEND_ERROR;
      }
    }
    break;

  case TFTP_EVENT_ERROR:
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data,
                 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* don't bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we're done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "%s", "tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL; /* not really the perfect return code for
                                  this */
  }
  return CURLE_OK;
}